

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ScatterAlongAxisLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_scatteralongaxis
          (NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x3ba) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3ba;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.scatteralongaxis_ =
         google::protobuf::Arena::
         CreateMaybeMessage<CoreML::Specification::ScatterAlongAxisLayerParams>(arena);
    (this->layer_).scatteralongaxis_ = (ScatterAlongAxisLayerParams *)LVar2;
  }
  return (ScatterAlongAxisLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::ScatterAlongAxisLayerParams* NeuralNetworkLayer::_internal_mutable_scatteralongaxis() {
  if (!_internal_has_scatteralongaxis()) {
    clear_layer();
    set_has_scatteralongaxis();
    layer_.scatteralongaxis_ = CreateMaybeMessage< ::CoreML::Specification::ScatterAlongAxisLayerParams >(GetArenaForAllocation());
  }
  return layer_.scatteralongaxis_;
}